

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::check_stream
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,char *message)

{
  long *plVar1;
  size_type *psVar2;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (((&this->field_0x48)[*(long *)(*(long *)&this->stream_ + -0x18)] & 5) == 0) {
    return;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"failed to ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_40);
  local_60._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar2) {
    local_60.field_2._M_allocated_capacity = *psVar2;
    local_60.field_2._8_8_ = plVar1[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar2;
  }
  local_60._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  raise_stream_error(this,&local_60);
}

Assistant:

void check_stream(const char* message)
    {
        if (stream_.fail())
        {
            raise_stream_error(std::string("failed to ") + message);
        }
    }